

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O1

bool __thiscall ServerService::startService(ServerService *this)

{
  byte *__s;
  _Alloc_hider data;
  uint __fd;
  int socketFD;
  ServerSegment *pSVar1;
  size_t sVar2;
  long lVar3;
  sockaddr *psVar4;
  ServerService *this_00;
  undefined8 *puVar5;
  bool bVar6;
  int iVar7;
  byte bVar8;
  socklen_t clientLength;
  string key;
  sockaddr_storage clientDetails;
  byte buffer [1472];
  sockaddr_storage in_stack_fffffffffffff8b8;
  socklen_t local_6bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  sockaddr local_678 [8];
  byte local_5f8 [1480];
  
  bVar8 = 0;
  bVar6 = false;
  memset(local_5f8,0,0x5c0);
  local_6bc = 0x80;
  do {
    __fd = ServerSocketUDP::getSocket(this->serverSocketUDP);
    this_00 = (ServerService *)(ulong)__fd;
    recvfrom(__fd,local_5f8,0x5c0,0,local_678,&local_6bc);
    pSVar1 = parseRequest(this_00,local_5f8);
    if ((pSVar1->data != (byte *)0x0) && (pSVar1->ackFlag == 'N')) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Received: ",10);
      __s = pSVar1->data;
      if (__s == (byte *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x109160);
      }
      else {
        sVar2 = strlen((char *)__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
      std::__cxx11::string::string
                ((string *)&local_6b8,(char *)pSVar1->data,(allocator *)&local_698);
      std::operator+(&local_698,"I received ",&local_6b8);
      std::__cxx11::string::operator=((string *)&local_6b8,(string *)&local_698);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_698._M_dataplus._M_p != &local_698.field_2) {
        operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
      }
      iVar7 = 200;
      do {
        std::__cxx11::string::append((char *)&local_6b8);
        data._M_p = local_6b8._M_dataplus._M_p;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      socketFD = ServerSocketUDP::getSocket(this->serverSocketUDP);
      iVar7 = this->receiverWindowSize;
      psVar4 = local_678;
      puVar5 = (undefined8 *)&stack0xfffffffffffff8b8;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *(undefined8 *)psVar4;
        psVar4 = (sockaddr *)(psVar4[-(ulong)bVar8].sa_data + 6);
        puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
      }
      sendSegments(this,(byte *)data._M_p,socketFD,in_stack_fffffffffffff8b8,iVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
      }
      bVar6 = true;
    }
    if (bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Sent all segments. Closing server connection.",0x2d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
    }
  } while( true );
}

Assistant:

bool ServerService::startService() {

    socklen_t clientLength;
    struct sockaddr_storage clientDetails;
    byte buffer[MTU];
    bzero(buffer, MTU);
    bool flag = false;
    clientLength = sizeof(clientDetails);
    while (true) {
        recvfrom(serverSocketUDP->getSocket(), buffer, MTU, 0, (struct sockaddr *) &clientDetails, &clientLength);
        ServerSegment *segment = parseRequest(buffer);
        if (segment->data && segment->ackFlag == 'N') {
            cout << "Received: ";
            cout << (char *) segment->data << endl;
            string key = (char *) segment->data;
            key = "I received " + key;
            for (int i = 0; i < 200; ++i) {
                key += "123 hjg ghjfhdjg hj cjchjfghjcghjc   yjccgyjvghjvg jyy yjcgyj vyj";
            }
//            todo 对收到信息做处理，并响应请求
            if (sendSegments((byte *) key.c_str(), serverSocketUDP->getSocket(), clientDetails, receiverWindowSize)) {
                flag = true;
            }
        }
        if (flag) {
            cout << "Sent all segments. Closing server connection." << endl;
//            break;
        }
    }
}